

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

TString * luaS_newlstr(lua_State *L,char *str,size_t l)

{
  int *piVar1;
  int iVar2;
  global_State *pgVar3;
  byte bVar4;
  uint h;
  int iVar5;
  TString *pTVar6;
  anon_union_8_2_b887aad4_for_u *paVar7;
  anon_union_8_2_b887aad4_for_u *paVar8;
  
  if (l < 0x29) {
    pgVar3 = L->l_G;
    h = luaS_hash(str,l,pgVar3->seed);
    iVar2 = (pgVar3->strt).size;
    paVar8 = (anon_union_8_2_b887aad4_for_u *)((pgVar3->strt).hash + (int)(iVar2 - 1U & h));
    paVar7 = paVar8;
    while (pTVar6 = paVar7->hnext, pTVar6 != (TString *)0x0) {
      if ((pTVar6->shrlen == l) && (iVar5 = bcmp(str,pTVar6 + 1,l), iVar5 == 0)) {
        bVar4 = pTVar6->marked ^ 3;
        if (((pgVar3->currentwhite ^ 3) & bVar4) != 0) {
          return pTVar6;
        }
        pTVar6->marked = bVar4;
        return pTVar6;
      }
      paVar7 = &pTVar6->u;
    }
    if ((iVar2 < 0x40000000) && (iVar2 <= (pgVar3->strt).nuse)) {
      luaS_resize(L,iVar2 * 2);
      paVar8 = (anon_union_8_2_b887aad4_for_u *)
               ((pgVar3->strt).hash + ((long)(int)h & (long)(pgVar3->strt).size - 1U));
    }
    pTVar6 = createstrobj(L,l,4,h);
    memcpy(pTVar6 + 1,str,l);
    pTVar6->shrlen = (lu_byte)l;
    (pTVar6->u).hnext = (TString *)*(TString **)paVar8;
    paVar8->hnext = pTVar6;
    piVar1 = &(pgVar3->strt).nuse;
    *piVar1 = *piVar1 + 1;
  }
  else {
    if (0x7fffffffffffffe6 < l) {
      luaM_toobig(L);
    }
    pTVar6 = luaS_createlngstrobj(L,l);
    memcpy(pTVar6 + 1,str,l);
  }
  return pTVar6;
}

Assistant:

TString *luaS_newlstr (lua_State *L, const char *str, size_t l) {
  if (l <= LUAI_MAXSHORTLEN)  /* short string? */
    return internshrstr(L, str, l);
  else {
    TString *ts;
    if (l >= (MAX_SIZE - sizeof(TString))/sizeof(char))
      luaM_toobig(L);
    ts = luaS_createlngstrobj(L, l);
    memcpy(getstr(ts), str, l * sizeof(char));
    return ts;
  }
}